

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void indexedX16_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  uint16_t address_00;
  uint16_t offset;
  
  offset = 0;
  address_00 = *address;
  read_word(info,&offset,address_00);
  *address = address_00 + 2;
  add_indexed_operand(info,M680X_REG_X,false,'\0','\x10',offset,false);
  return;
}

Assistant:

static void indexedX16_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	uint16_t offset = 0;

	read_word(info, &offset, *address);
	*address += 2;
	add_indexed_operand(info, M680X_REG_X, false, 0, M680X_OFFSET_BITS_16,
		offset, false);
}